

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void ensure_buckets(ecs_map_t *map,int32_t new_count)

{
  int iVar1;
  int32_t iVar2;
  ecs_bucket_t *peVar3;
  
  iVar1 = map->bucket_count;
  iVar2 = ecs_next_pow_of_2(new_count);
  if (iVar1 < iVar2 && iVar2 != 0) {
    peVar3 = (ecs_bucket_t *)(*ecs_os_api.realloc_)(map->buckets,iVar2 * 0x18);
    map->buckets = peVar3;
    map->bucket_count = iVar2;
    memset(peVar3 + iVar1,0,(long)((iVar2 - iVar1) * 0x18));
    return;
  }
  return;
}

Assistant:

static
void ensure_buckets(
    ecs_map_t *map,
    int32_t new_count)
{
    int32_t bucket_count = map->bucket_count;
    new_count = ecs_next_pow_of_2(new_count);
    if (new_count && new_count > bucket_count) {
        map->buckets = ecs_os_realloc(map->buckets, new_count * ECS_SIZEOF(ecs_bucket_t));
        map->bucket_count = new_count;

        ecs_os_memset(
            ECS_OFFSET(map->buckets, bucket_count * ECS_SIZEOF(ecs_bucket_t)), 
            0, (new_count - bucket_count) * ECS_SIZEOF(ecs_bucket_t));
    }
}